

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

uint __thiscall
ObjectBlockPool<16,_4096>::FreePending(ObjectBlockPool<16,_4096> *this,uint *usedMemory)

{
  uint uVar1;
  SmallBlock<16> *pSVar2;
  MySmallBlock *freedBlock;
  SmallBlock<16> **ppSVar3;
  uint uVar4;
  uint index;
  
  uVar1 = (this->objectsToFree).count;
  uVar4 = 0;
  for (index = 0; uVar1 != index; index = index + 1) {
    ppSVar3 = FastVector<SmallBlock<16>_*,_false,_false>::operator[](&this->objectsToFree,index);
    pSVar2 = *ppSVar3;
    if ((pSVar2->data[0] & 3U) == 0) {
      pSVar2->marker = (ulong)this->freeBlocks | 2;
      this->freeBlocks = pSVar2;
      uVar4 = uVar4 + 1;
    }
  }
  (this->objectsToFree).count = 0;
  *usedMemory = *usedMemory + uVar4 * -0x10;
  return uVar4;
}

Assistant:

unsigned FreePending(unsigned &usedMemory)
	{
		unsigned freed = 0;

		for(unsigned i = 0, e = objectsToFree.size(); i < e; i++)
		{
			MySmallBlock *block = objectsToFree[i];

			markerType &marker = block->marker;

			// Check flags again, finalizers might have some objects reachable
			if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
			{
				Free(block);

				freed++;
			}
		}

		objectsToFree.clear();

		usedMemory -= freed * elemSize;

		return freed;
	}